

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

value_type __thiscall djb::npf::eval(npf *this,vec3 *dirIn,vec3 *dirOut,void *param_3)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  pointer pvVar9;
  long lVar10;
  float *extraout_RDX;
  float *pfVar11;
  float *extraout_RDX_00;
  undefined4 uVar12;
  uint uVar13;
  npf *pnVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  float fVar19;
  double dVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  value_type vVar35;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float local_38;
  float fStack_34;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  
  if ((0.0 <= dirOut->z) && (0.0 <= *(float *)((long)param_3 + 8))) {
    fVar32 = dirOut->x + *param_3;
    fVar34 = dirOut->y + *(float *)((long)param_3 + 4);
    fVar31 = dirOut->z + *(float *)((long)param_3 + 8);
    fVar19 = fVar31 * fVar31 + fVar32 * fVar32 + fVar34 * fVar34;
    if ((fVar19 != 0.0) || (NAN(fVar19))) {
      if (fVar19 <= 0.0) {
        __assert_fail("x > T(0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                      ,0x259,"T djb::inversesqrt(const T &) [T = float]");
      }
      fVar22 = 1.0 / SQRT(fVar19);
      fVar23 = fVar32 * fVar22 * 0.0 + fVar34 * fVar22 * 0.0 + fVar31 * fVar22;
      fVar19 = 0.0;
      if (0.0 <= fVar23) {
        fVar19 = fVar23;
      }
      fVar23 = 1.0;
      if (fVar19 <= 1.0) {
        fVar23 = fVar19;
      }
      pnVar14 = this;
      fVar23 = acosf(fVar23);
      uVar12 = SUB84(pnVar14,0);
      fVar31 = fVar31 * fVar22 * dirOut->z +
               fVar32 * fVar22 * dirOut->x + fVar34 * fVar22 * dirOut->y;
      fVar19 = 0.0;
      if (0.0 <= fVar31) {
        fVar19 = fVar31;
      }
      fVar31 = 1.0;
      if (fVar19 <= 1.0) {
        fVar31 = fVar19;
      }
      fVar31 = acosf(fVar31);
      fVar32 = dirOut->x * 0.0 + dirOut->y * 0.0 + dirOut->z;
      fVar19 = 0.0;
      if (0.0 <= fVar32) {
        fVar19 = fVar32;
      }
      fVar32 = 1.0;
      if (fVar19 <= 1.0) {
        fVar32 = fVar19;
      }
      fVar32 = acosf(fVar32);
      fVar34 = *param_3 * 0.0 + *(float *)((long)param_3 + 4) * 0.0 + *(float *)((long)param_3 + 8);
      fVar19 = 0.0;
      if (0.0 <= fVar34) {
        fVar19 = fVar34;
      }
      fVar34 = 1.0;
      if (fVar19 <= 1.0) {
        fVar34 = fVar19;
      }
      fVar22 = acosf(fVar34);
      lVar8 = *(long *)&dirIn->z;
      lVar10 = (long)(int)dirIn[2].z * 0x1800;
      uVar4 = *(undefined8 *)(lVar8 + lVar10);
      fVar19 = *(float *)(lVar8 + 8 + lVar10);
      lVar10 = (long)((int)dirIn[2].z * 0x200 + 1);
      uVar5 = *(undefined8 *)(lVar8 + lVar10 * 0xc);
      fVar34 = *(float *)(lVar8 + 8 + lVar10 * 0xc);
      dVar20 = ((double)fVar23 / 3.141592653589793) * 0.5 * 90.0 * 90.0;
      if (dVar20 < 0.0) {
        dVar20 = sqrt(dVar20);
      }
      else {
        dVar20 = SQRT(dVar20);
      }
      dVar24 = 0.0;
      if (0.0 <= dVar20) {
        dVar24 = dVar20;
      }
      dVar20 = 89.0;
      if (dVar24 <= 89.0) {
        dVar20 = dVar24;
      }
      if (*(char *)&dirIn[3].x == '\x01') {
        uVar12 = 0x1b3534;
        printf("iD: %i\n");
      }
      lVar10 = (long)(int)dirIn[2].z * 0x200;
      lVar8 = *(long *)&dirIn->z;
      lVar16 = (long)(int)dVar20 + 2 + lVar10;
      auVar25._0_8_ = (double)fVar22;
      auVar25._8_8_ = (double)fVar32;
      auVar25 = divpd(auVar25,_DAT_001af300);
      auVar26._0_4_ = (float)(auVar25._0_8_ * 0.5 * 90.0);
      auVar26._4_4_ = (float)(auVar25._8_8_ * 0.5 * 90.0);
      auVar26._8_8_ = 0;
      auVar25 = maxps(ZEXT816(0),auVar26);
      iVar17 = -(uint)(89.0 < auVar25._0_4_);
      iVar18 = -(uint)(89.0 < auVar25._4_4_);
      auVar28._4_4_ = iVar18;
      auVar28._0_4_ = iVar17;
      auVar28._8_4_ = iVar18;
      auVar28._12_4_ = iVar18;
      auVar27._8_8_ = auVar28._8_8_;
      auVar27._4_4_ = iVar17;
      auVar27._0_4_ = iVar17;
      uVar13 = movmskpd(uVar12,auVar27);
      iVar17 = (int)(auVar25._4_4_ + 2.0 + 90.0);
      uVar6 = *(undefined8 *)(lVar8 + lVar16 * 0xc);
      if ((uVar13 & 2) != 0) {
        iVar17 = 0xb5;
      }
      local_78 = (float)uVar5;
      fStack_74 = (float)((ulong)uVar5 >> 0x20);
      fVar23 = local_78 * (float)uVar6;
      fVar33 = fStack_74 * (float)((ulong)uVar6 >> 0x20);
      iVar18 = (int)lVar10;
      iVar15 = (int)(auVar25._0_4_ + 2.0 + 90.0);
      uVar5 = *(undefined8 *)(lVar8 + (long)(iVar17 + iVar18) * 0xc);
      if ((uVar13 & 1) != 0) {
        iVar15 = 0xb5;
      }
      uVar6 = *(undefined8 *)(lVar8 + (long)(iVar15 + iVar18) * 0xc);
      dVar20 = ((double)fVar31 / 3.141592653589793) * 0.5 * 90.0;
      dVar24 = 0.0;
      if (0.0 <= dVar20) {
        dVar24 = dVar20;
      }
      dVar20 = 89.0;
      if (dVar24 <= 89.0) {
        dVar20 = dVar24;
      }
      lVar10 = (long)((int)dVar20 + 0xb6 + iVar18);
      uVar7 = *(undefined8 *)(lVar8 + lVar10 * 0xc);
      fVar31 = *(float *)(lVar8 + 8 + lVar16 * 0xc);
      fVar1 = *(float *)(lVar8 + 8 + lVar10 * 0xc);
      fVar2 = *(float *)(lVar8 + 8 + (long)(iVar15 + iVar18) * 0xc);
      fVar3 = *(float *)(lVar8 + 8 + (long)(iVar17 + iVar18) * 0xc);
      fVar32 = cosf(fVar32);
      fVar22 = cosf(fVar22);
      auVar30._4_4_ = extraout_XMM0_Db;
      auVar30._0_4_ = fVar32;
      auVar30._8_4_ = extraout_XMM0_Db;
      auVar30._12_4_ = extraout_XMM0_Db_00;
      auVar29._8_8_ = auVar30._8_8_;
      auVar29._4_4_ = fVar22;
      auVar29._0_4_ = fVar32;
      auVar25 = divps(_DAT_001af220,auVar29);
      fVar22 = auVar25._0_4_;
      fVar21 = auVar25._4_4_;
      fVar32 = *(float *)((long)param_3 + 8);
      local_78 = (float)uVar5;
      fStack_74 = (float)((ulong)uVar5 >> 0x20);
      local_68 = (float)uVar6;
      fStack_64 = (float)((ulong)uVar6 >> 0x20);
      local_38 = (float)uVar4;
      fStack_34 = (float)((ulong)uVar4 >> 0x20);
      fVar23 = fVar32 * (local_38 + fVar21 * local_68 * fVar22 * local_78 * (float)uVar7 * fVar23) *
               0.0625;
      fVar33 = fVar32 * (fStack_34 +
                        fVar21 * fStack_64 *
                        fVar22 * fStack_74 * (float)((ulong)uVar7 >> 0x20) * fVar33) * 0.0625;
      fVar31 = (fVar19 + fVar2 * fVar21 * fVar34 * fVar31 * fVar1 * fVar3 * fVar22) * fVar32 *
               0.0625;
      *(undefined1 *)&dirIn[3].x = 0;
      fVar19 = fVar31 * fVar31 + fVar23 * fVar23 + fVar33 * fVar33;
      if ((!NAN(fVar19)) && (ABS(fVar19) <= 10000.0)) {
        (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)0x3;
        pvVar9 = (pointer)operator_new(0xc);
        (this->m_uber_texture).super__Vector_base<djb::vec3,_std::allocator<djb::vec3>_>._M_impl.
        super__Vector_impl_data._M_start = pvVar9;
        pvVar9->x = fVar23;
        pvVar9->y = fVar33;
        pvVar9->z = fVar31;
        pfVar11 = extraout_RDX_00;
        goto LAB_001455c4;
      }
    }
  }
  (**(code **)(*(long *)dirIn + 0x10))(this,dirIn);
  pfVar11 = extraout_RDX;
LAB_001455c4:
  vVar35._M_data = pfVar11;
  vVar35._M_size = (size_t)this;
  return vVar35;
}

Assistant:

brdf::value_type npf::eval(const vec3 &dirIn, const vec3 &dirOut, const void *) const
{
	if (dirIn.z < 0 || dirOut.z < 0)
		return zero_value();

	vec3 tmp = dirIn + dirOut;
	float_t nrm = dot(tmp, tmp);

	if (nrm == 0)
		return zero_value();
	vec3 dirNormal = vec3(0, 0, 1);
	vec3 dirH = tmp * inversesqrt(nrm);
	float thetaH = acos(sat(dot(dirH, dirNormal)));
	float thetaD = acos(sat(dot(dirIn, dirH)));
	float thetaI = acos(sat(dot(dirIn, dirNormal)));
	float thetaO = acos(sat(dot(dirOut, dirNormal)));

	// BRDF texture has a fixed size of 512x256
	vec2 uv;
	uv.y = float(m_id)/256.;

	uv.x = 0.0/512.;
	vec3 rhoD = uberTextureLookup(uv);
	//if (m_first) printf("%f %f %f\n", rhoD.x, rhoD.y, rhoD.z); //OK

	uv.x = 1.0/512.;
	vec3 rhoS = uberTextureLookup(uv);
	//if (m_first) printf("%f %f %f\n", rhoS.x, rhoS.y, rhoS.z); //OK

	int iD = int(clamp(sqrt(thetaH / M_PI / 2
	             * 90.0 * 90.0), 0.0, 89.0));
	uv.x = float(iD+2)/512.;
	if (m_first)
		printf("iD: %i\n", iD);
	vec3 D = uberTextureLookup(uv);
	D = uberTextureLookupInt(iD+2); //OK

	vec3 G1I = lookupInterpolatedG1(m_id, thetaI);

	vec3 G1O = lookupInterpolatedG1(m_id, thetaO);

	auto tmp2 = thetaD / M_PI / 2 * 90.0;
	int iF = int(clamp(tmp2, 0.0, 89.0));
	uv.x = float(iF+2+90+90)/512.;
	vec3 F = uberTextureLookup(uv);
	F = uberTextureLookupInt(iF+2+90+90); //OK

	vec3 BRDF = (rhoD) + (rhoS) * D * F *
	            (G1I / cos(thetaI)) * (G1O / cos(thetaO));
	BRDF*= dirOut.z;
	BRDF*= 1.0 / 16;

	m_first = false;

	if (fabs(dot(BRDF, BRDF)) > 9999.9999f || std::isnan(dot(BRDF, BRDF))) {
		return zero_value();
	}

	return brdf::value_type({BRDF.x, BRDF.y, BRDF.z});
}